

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

int write_mtree_entry(archive_write *a,mtree_entry_conflict *me)

{
  mtree_writer *mtree;
  reg_info *prVar1;
  ulong length;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  mode_t mVar6;
  uint uVar7;
  char *pcVar8;
  archive_string *s;
  
  mtree = (mtree_writer *)a->format_data;
  if (me->dir_info != (dir_info *)0x0) {
    if (mtree->classic != 0) {
      if (mtree->dironly == 0) {
        archive_strappend_char(&mtree->buf,'\n');
      }
      if ((me->parentdir).s == (char *)0x0) {
        archive_string_sprintf(&mtree->buf,"# %s\n",(me->basename).s);
      }
      else {
        archive_string_sprintf(&mtree->buf,"# %s/%s\n");
      }
    }
    if (mtree->output_global_set != 0) {
      write_global(mtree);
    }
  }
  (mtree->ebuf).length = 0;
  s = &mtree->ebuf;
  if (mtree->indent == 0 && mtree->classic == 0) {
    s = &mtree->buf;
  }
  if ((mtree->classic == 0) && (pcVar8 = (me->parentdir).s, pcVar8 != (char *)0x0)) {
    mtree_quote(s,pcVar8);
    archive_strappend_char(s,'/');
  }
  mtree_quote(s,(me->basename).s);
  uVar3 = (mtree->set).keys;
  uVar7 = mtree->keys;
  if (uVar3 != 0) {
    if (((uVar3 & 0x30) != 0) && ((mtree->set).gid == me->gid)) {
      uVar7 = uVar7 & 0xffffffcf;
    }
    if (((uVar3 & 0x300000) != 0) && ((mtree->set).uid == me->uid)) {
      uVar7 = uVar7 & 0xffcfffff;
    }
    if ((((uVar3 & 8) != 0) && ((mtree->set).fflags_set == me->fflags_set)) &&
       ((mtree->set).fflags_clear == me->fflags_clear)) {
      uVar7 = uVar7 & 0xfffffff7;
    }
    if (((uVar3 >> 9 & 1) != 0) && ((mtree->set).mode == me->mode)) {
      uVar7 = uVar7 & 0xfffffdff;
    }
    uVar2 = me->filetype - 0x1000 >> 0xc;
    uVar5 = me->filetype << 0x14 | uVar2;
    if (uVar5 < 0xc) {
      if ((0xa23U >> (uVar2 & 0x1f) & 1) != 0) goto LAB_00486641;
      if (uVar5 != 3) goto LAB_00486ab2;
      mVar6 = 0x4000;
    }
    else {
LAB_00486ab2:
      mVar6 = 0x8000;
    }
    if (((uVar3 >> 0x13 & 1) != 0) && ((mtree->set).type == mVar6)) {
      uVar7 = uVar7 & 0xfff7ffff;
    }
  }
LAB_00486641:
  if ((((uVar7 >> 10 & 1) != 0) && (me->nlink != 1)) && (me->filetype != 0x4000)) {
    archive_string_sprintf(s," nlink=%u");
  }
  if (((uVar7 & 0x20) != 0) && ((me->gname).length != 0)) {
    archive_strcat(s," gname=");
    mtree_quote(s,(me->gname).s);
  }
  if (((uVar7 >> 0x15 & 1) != 0) && ((me->uname).length != 0)) {
    archive_strcat(s," uname=");
    mtree_quote(s,(me->uname).s);
  }
  if ((uVar7 & 8) != 0) {
    if ((me->fflags_text).length == 0) {
      if (((mtree->set).processing != 0) && (((mtree->set).keys & 8) != 0)) {
        archive_strcat(s," flags=none");
      }
    }
    else {
      archive_strcat(s," flags=");
      mtree_quote(s,(me->fflags_text).s);
    }
  }
  if ((uVar7 >> 0x12 & 1) != 0) {
    archive_string_sprintf(s," time=%jd.%jd",me->mtime,me->mtime_nsec);
  }
  if ((uVar7 >> 9 & 1) != 0) {
    archive_string_sprintf(s," mode=%o",(ulong)me->mode);
  }
  if ((uVar7 & 0x10) != 0) {
    archive_string_sprintf(s," gid=%jd",me->gid);
  }
  if ((uVar7 >> 0x14 & 1) != 0) {
    archive_string_sprintf(s," uid=%jd",me->uid);
  }
  if ((uVar7 >> 0x1a & 1) != 0) {
    archive_string_sprintf(s," inode=%jd",me->ino);
  }
  if ((uVar7 >> 0x1b & 1) != 0) {
    archive_string_sprintf(s," resdevice=native,%ju,%ju",me->devmajor,me->devminor);
  }
  switch(me->filetype << 0x14 | me->filetype - 0x1000 >> 0xc) {
  case 0:
    if ((uVar7 >> 0x13 & 1) == 0) goto LAB_0048692f;
    pcVar8 = " type=fifo";
    break;
  case 1:
    if ((uVar7 >> 0x13 & 1) != 0) {
      pcVar8 = " type=char";
LAB_004868c4:
      archive_strcat(s,pcVar8);
    }
    goto LAB_004868cc;
  default:
    if ((uVar7 >> 0x13 & 1) != 0) {
      archive_strcat(s," type=file");
    }
    if ((short)uVar7 < 0) {
      archive_string_sprintf(s," size=%jd",me->size);
    }
    goto LAB_0048692f;
  case 3:
    if ((uVar7 >> 0x13 & 1) == 0) goto LAB_0048692f;
    pcVar8 = " type=dir";
    break;
  case 5:
    if ((uVar7 >> 0x13 & 1) != 0) {
      pcVar8 = " type=block";
      goto LAB_004868c4;
    }
LAB_004868cc:
    if ((uVar7 & 2) != 0) {
      archive_string_sprintf(s," device=native,%ju,%ju",me->rdevmajor,me->rdevminor);
    }
    goto LAB_0048692f;
  case 9:
    if ((uVar7 >> 0x13 & 1) != 0) {
      archive_strcat(s," type=link");
    }
    if ((uVar7 >> 0x10 & 1) != 0) {
      archive_strcat(s," link=");
      mtree_quote(s,(me->symlink).s);
    }
    goto LAB_0048692f;
  case 0xb:
    if ((uVar7 >> 0x13 & 1) == 0) goto LAB_0048692f;
    pcVar8 = " type=socket";
  }
  archive_strcat(s,pcVar8);
LAB_0048692f:
  prVar1 = me->reg_info;
  if (prVar1 != (reg_info *)0x0) {
    uVar3 = prVar1->compute_sum;
    if ((uVar3 & 1) != 0) {
      archive_string_sprintf(s," cksum=%ju",(ulong)prVar1->crc);
      uVar3 = prVar1->compute_sum;
    }
    if ((uVar3 >> 8 & 1) != 0) {
      archive_strcat(s," md5digest=");
      strappend_bin(s,prVar1->buf_md5,0x10);
      uVar3 = prVar1->compute_sum;
    }
    if ((uVar3 >> 0xd & 1) != 0) {
      archive_strcat(s," rmd160digest=");
      strappend_bin(s,prVar1->buf_rmd160,0x14);
      uVar3 = prVar1->compute_sum;
    }
    if ((uVar3 >> 0xe & 1) != 0) {
      archive_strcat(s," sha1digest=");
      strappend_bin(s,prVar1->buf_sha1,0x14);
      uVar3 = prVar1->compute_sum;
    }
    if ((uVar3 >> 0x17 & 1) != 0) {
      archive_strcat(s," sha256digest=");
      strappend_bin(s,prVar1->buf_sha256,0x20);
      uVar3 = prVar1->compute_sum;
    }
    if ((uVar3 >> 0x18 & 1) != 0) {
      archive_strcat(s," sha384digest=");
      strappend_bin(s,prVar1->buf_sha384,0x30);
      uVar3 = prVar1->compute_sum;
    }
    if ((uVar3 >> 0x19 & 1) != 0) {
      archive_strcat(s," sha512digest=");
      strappend_bin(s,prVar1->buf_sha512,0x40);
    }
  }
  archive_strappend_char(s,'\n');
  if ((mtree->indent != 0) || (mtree->classic != 0)) {
    mtree_indent(mtree);
  }
  length = (mtree->buf).length;
  if (length < 0x8001) {
    iVar4 = 0;
  }
  else {
    iVar4 = __archive_write_output(a,(mtree->buf).s,length);
    (mtree->buf).length = 0;
  }
  return iVar4;
}

Assistant:

static int
write_mtree_entry(struct archive_write *a, struct mtree_entry *me)
{
	struct mtree_writer *mtree = a->format_data;
	struct archive_string *str;
	int keys, ret;

	if (me->dir_info) {
		if (mtree->classic) {
			/*
			 * Output a comment line to describe the full
			 * pathname of the entry as mtree utility does
			 * while generating classic format.
			 */
			if (!mtree->dironly)
				archive_strappend_char(&mtree->buf, '\n');
			if (me->parentdir.s)
				archive_string_sprintf(&mtree->buf,
				    "# %s/%s\n",
				    me->parentdir.s, me->basename.s);
			else
				archive_string_sprintf(&mtree->buf,
				    "# %s\n",
				    me->basename.s);
		}
		if (mtree->output_global_set)
			write_global(mtree);
	}
	archive_string_empty(&mtree->ebuf);
	str = (mtree->indent || mtree->classic)? &mtree->ebuf : &mtree->buf;

	if (!mtree->classic && me->parentdir.s) {
		/*
		 * If generating format is not classic one(v1), output
		 * a full pathname.
		 */
		mtree_quote(str, me->parentdir.s);
		archive_strappend_char(str, '/');
	}
	mtree_quote(str, me->basename.s);

	keys = get_global_set_keys(mtree, me);
	if ((keys & F_NLINK) != 0 &&
	    me->nlink != 1 && me->filetype != AE_IFDIR)
		archive_string_sprintf(str, " nlink=%u", me->nlink);

	if ((keys & F_GNAME) != 0 && archive_strlen(&me->gname) > 0) {
		archive_strcat(str, " gname=");
		mtree_quote(str, me->gname.s);
	}
	if ((keys & F_UNAME) != 0 && archive_strlen(&me->uname) > 0) {
		archive_strcat(str, " uname=");
		mtree_quote(str, me->uname.s);
	}
	if ((keys & F_FLAGS) != 0) {
		if (archive_strlen(&me->fflags_text) > 0) {
			archive_strcat(str, " flags=");
			mtree_quote(str, me->fflags_text.s);
		} else if (mtree->set.processing &&
		    (mtree->set.keys & F_FLAGS) != 0)
			/* Overwrite the global parameter. */
			archive_strcat(str, " flags=none");
	}
	if ((keys & F_TIME) != 0)
		archive_string_sprintf(str, " time=%jd.%jd",
		    (intmax_t)me->mtime, (intmax_t)me->mtime_nsec);
	if ((keys & F_MODE) != 0)
		archive_string_sprintf(str, " mode=%o", (unsigned int)me->mode);
	if ((keys & F_GID) != 0)
		archive_string_sprintf(str, " gid=%jd", (intmax_t)me->gid);
	if ((keys & F_UID) != 0)
		archive_string_sprintf(str, " uid=%jd", (intmax_t)me->uid);

	if ((keys & F_INO) != 0)
		archive_string_sprintf(str, " inode=%jd", (intmax_t)me->ino);
	if ((keys & F_RESDEV) != 0) {
		archive_string_sprintf(str,
		    " resdevice=native,%ju,%ju",
		    (uintmax_t)me->devmajor,
		    (uintmax_t)me->devminor);
	}

	switch (me->filetype) {
	case AE_IFLNK:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=link");
		if ((keys & F_SLINK) != 0) {
			archive_strcat(str, " link=");
			mtree_quote(str, me->symlink.s);
		}
		break;
	case AE_IFSOCK:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=socket");
		break;
	case AE_IFCHR:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=char");
		if ((keys & F_DEV) != 0) {
			archive_string_sprintf(str,
			    " device=native,%ju,%ju",
			    (uintmax_t)me->rdevmajor,
			    (uintmax_t)me->rdevminor);
		}
		break;
	case AE_IFBLK:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=block");
		if ((keys & F_DEV) != 0) {
			archive_string_sprintf(str,
			    " device=native,%ju,%ju",
			    (uintmax_t)me->rdevmajor,
			    (uintmax_t)me->rdevminor);
		}
		break;
	case AE_IFDIR:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=dir");
		break;
	case AE_IFIFO:
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=fifo");
		break;
	case AE_IFREG:
	default:	/* Handle unknown file types as regular files. */
		if ((keys & F_TYPE) != 0)
			archive_strcat(str, " type=file");
		if ((keys & F_SIZE) != 0)
			archive_string_sprintf(str, " size=%jd",
			    (intmax_t)me->size);
		break;
	}

	/* Write a bunch of sum. */
	if (me->reg_info)
		sum_write(str, me->reg_info);

	archive_strappend_char(str, '\n');
	if (mtree->indent || mtree->classic)
		mtree_indent(mtree);

	if (mtree->buf.length > 32768) {
		ret = __archive_write_output(
			a, mtree->buf.s, mtree->buf.length);
		archive_string_empty(&mtree->buf);
	} else
		ret = ARCHIVE_OK;
	return (ret);
}